

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::WaitSemaphores
          (VulkanLogicalDevice *this,VkSemaphoreWaitInfo *WaitInfo,uint64_t Timeout)

{
  VkResult VVar1;
  char (*in_RCX) [56];
  string msg;
  string local_40;
  
  if (WaitInfo->sType != VK_STRUCTURE_TYPE_SEMAPHORE_WAIT_INFO) {
    Diligent::FormatString<char[26],char[56]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"WaitInfo.sType == VK_STRUCTURE_TYPE_SEMAPHORE_WAIT_INFO",in_RCX);
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"WaitSemaphores",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x2ae);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  VVar1 = (*vkWaitSemaphoresKHR)(this->m_VkDevice,WaitInfo,Timeout);
  return VVar1;
}

Assistant:

VkResult VulkanLogicalDevice::WaitSemaphores(const VkSemaphoreWaitInfo& WaitInfo, uint64_t Timeout) const
{
#if DILIGENT_USE_VOLK
    VERIFY_EXPR(WaitInfo.sType == VK_STRUCTURE_TYPE_SEMAPHORE_WAIT_INFO);
    return vkWaitSemaphoresKHR(m_VkDevice, &WaitInfo, Timeout);
#else
    UNSUPPORTED("vkWaitSemaphoresKHR is only available through Volk");
    return VK_ERROR_FEATURE_NOT_PRESENT;
#endif
}